

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_runtime.cpp
# Opt level: O0

void propagateFPControl(kmp_team_t *team)

{
  long in_RDI;
  kmp_uint32 mxcsr;
  kmp_int16 x87_fpu_control_word;
  uint local_10;
  short local_a;
  long local_8;
  
  if (__kmp_inherit_fp_control == 0) {
    if (*(char *)(in_RDI + 0x220) != '\0') {
      *(undefined1 *)(in_RDI + 0x220) = 0;
    }
  }
  else {
    local_8 = in_RDI;
    __kmp_store_x87_fpu_control_word(&local_a);
    __kmp_store_mxcsr(&local_10);
    if (*(short *)(local_8 + 0x222) != local_a) {
      *(short *)(local_8 + 0x222) = local_a;
    }
    if (*(uint *)(local_8 + 0x224) != (local_10 & 0xffffffc0)) {
      *(uint *)(local_8 + 0x224) = local_10 & 0xffffffc0;
    }
    if (*(char *)(local_8 + 0x220) != '\x01') {
      *(undefined1 *)(local_8 + 0x220) = 1;
    }
  }
  return;
}

Assistant:

inline static void propagateFPControl(kmp_team_t *team) {
  if (__kmp_inherit_fp_control) {
    kmp_int16 x87_fpu_control_word;
    kmp_uint32 mxcsr;

    // Get master values of FPU control flags (both X87 and vector)
    __kmp_store_x87_fpu_control_word(&x87_fpu_control_word);
    __kmp_store_mxcsr(&mxcsr);
    mxcsr &= KMP_X86_MXCSR_MASK;

    // There is no point looking at t_fp_control_saved here.
    // If it is TRUE, we still have to update the values if they are different
    // from those we now have. If it is FALSE we didn't save anything yet, but
    // our objective is the same. We have to ensure that the values in the team
    // are the same as those we have.
    // So, this code achieves what we need whether or not t_fp_control_saved is
    // true. By checking whether the value needs updating we avoid unnecessary
    // writes that would put the cache-line into a written state, causing all
    // threads in the team to have to read it again.
    KMP_CHECK_UPDATE(team->t.t_x87_fpu_control_word, x87_fpu_control_word);
    KMP_CHECK_UPDATE(team->t.t_mxcsr, mxcsr);
    // Although we don't use this value, other code in the runtime wants to know
    // whether it should restore them. So we must ensure it is correct.
    KMP_CHECK_UPDATE(team->t.t_fp_control_saved, TRUE);
  } else {
    // Similarly here. Don't write to this cache-line in the team structure
    // unless we have to.
    KMP_CHECK_UPDATE(team->t.t_fp_control_saved, FALSE);
  }
}